

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool cmFortranStreamContainsSequence(istream *ifs,char *seq,int len)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  while ((iVar3 < len &&
         (iVar1 = std::istream::get(), ((byte)ifs[*(long *)(*(long *)ifs + -0x18) + 0x20] & 5) == 0)
         )) {
    lVar2 = (long)iVar3;
    iVar3 = iVar3 + 1;
    if (iVar1 != seq[lVar2]) {
      iVar3 = 0;
    }
  }
  return len <= iVar3;
}

Assistant:

static bool cmFortranStreamContainsSequence(std::istream& ifs, const char* seq,
                                            int len)
{
  assert(len > 0);

  int cur = 0;
  while (cur < len) {
    // Get the next character.
    int token = ifs.get();
    if (!ifs) {
      return false;
    }

    // Check the character.
    if (token == static_cast<int>(seq[cur])) {
      ++cur;
    } else {
      // Assume the sequence has no repeating subsequence.
      cur = 0;
    }
  }

  // The entire sequence was matched.
  return true;
}